

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

Memory * wasm::
         addModuleElement<std::vector<std::unique_ptr<wasm::Memory,std::default_delete<wasm::Memory>>,std::allocator<std::unique_ptr<wasm::Memory,std::default_delete<wasm::Memory>>>>,std::unordered_map<wasm::Name,wasm::Memory*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Memory*>>>,wasm::Memory>
                   (vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                    *v,unordered_map<wasm::Name,_wasm::Memory_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Memory_*>_>_>
                       *m,unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *curr,
                   string *funcName)

{
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *puVar1;
  bool bVar2;
  pointer pMVar3;
  Fatal *pFVar4;
  mapped_type pMVar5;
  pointer __k;
  mapped_type *ppMVar6;
  Name name;
  Memory *ret;
  unordered_map<wasm::Name,_wasm::Memory_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Memory_*>_>_>
  *local_1d0;
  char *local_1c8;
  Fatal local_1b0;
  string *local_28;
  string *funcName_local;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *curr_local;
  unordered_map<wasm::Name,_wasm::Memory_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Memory_*>_>_>
  *m_local;
  vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
  *v_local;
  
  local_28 = funcName;
  funcName_local = (string *)curr;
  curr_local = (unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)m;
  m_local = (unordered_map<wasm::Name,_wasm::Memory_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Memory_*>_>_>
             *)v;
  pMVar3 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(curr);
  bVar2 = IString::is((IString *)pMVar3);
  puVar1 = curr_local;
  if (!bVar2) {
    Fatal::Fatal(&local_1b0);
    pFVar4 = Fatal::operator<<(&local_1b0,(char (*) [9])"Module::");
    pFVar4 = Fatal::operator<<(pFVar4,funcName);
    Fatal::operator<<(pFVar4,(char (*) [13])": empty name");
    Fatal::~Fatal(&local_1b0);
  }
  pMVar3 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(curr);
  local_1d0 = (unordered_map<wasm::Name,_wasm::Memory_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Memory_*>_>_>
               *)(pMVar3->super_Importable).super_Named.name.super_IString.str._M_len;
  local_1c8 = (pMVar3->super_Importable).super_Named.name.super_IString.str._M_str;
  name.super_IString.str._M_str = (char *)local_1d0;
  name.super_IString.str._M_len = (size_t)local_1c8;
  pMVar5 = getModuleElementOrNull<std::unordered_map<wasm::Name,wasm::Memory*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Memory*>>>>
                     ((wasm *)puVar1,local_1d0,name);
  if (pMVar5 != (mapped_type)0x0) {
    Fatal::Fatal((Fatal *)&ret);
    pFVar4 = Fatal::operator<<((Fatal *)&ret,(char (*) [9])"Module::");
    pFVar4 = Fatal::operator<<(pFVar4,funcName);
    pFVar4 = Fatal::operator<<(pFVar4,(char (*) [3])0x290727d);
    pMVar3 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(curr);
    pFVar4 = Fatal::operator<<(pFVar4,(Name *)pMVar3);
    Fatal::operator<<(pFVar4,(char (*) [16])" already exists");
    Fatal::~Fatal((Fatal *)&ret);
  }
  pMVar3 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::get(curr);
  puVar1 = curr_local;
  __k = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(curr);
  ppMVar6 = std::
            unordered_map<wasm::Name,_wasm::Memory_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Memory_*>_>_>
            ::operator[]((unordered_map<wasm::Name,_wasm::Memory_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Memory_*>_>_>
                          *)puVar1,(key_type *)__k);
  *ppMVar6 = pMVar3;
  std::
  vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
  ::push_back((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               *)m_local,curr);
  return pMVar3;
}

Assistant:

Elem* addModuleElement(Vector& v,
                       Map& m,
                       std::unique_ptr<Elem> curr,
                       std::string funcName) {
  if (!curr->name.is()) {
    Fatal() << "Module::" << funcName << ": empty name";
  }
  if (getModuleElementOrNull(m, curr->name)) {
    Fatal() << "Module::" << funcName << ": " << curr->name
            << " already exists";
  }
  auto* ret = m[curr->name] = curr.get();
  v.push_back(std::move(curr));
  return ret;
}